

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O2

void screen_init(void)

{
  short sVar1;
  short sVar2;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  Display *pDVar6;
  int iVar7;
  long lVar8;
  XRRScreenSize *pXVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  float fVar14;
  float local_24;
  float local_20;
  int nscreens;
  
  if (fl_display == (Display *)0x0) {
    fl_open_display();
  }
  if (screen_init::XRRSizes_f == (XRRSizes_type)0x0) {
    lVar8 = dlopen("libXrandr.so.2",1);
    if ((lVar8 != 0) || (lVar8 = dlopen("libXrandr.so",1), lVar8 != 0)) {
      screen_init::XRRSizes_f = (XRRSizes_type)dlsym(lVar8,"XRRSizes");
    }
    if (screen_init::XRRSizes_f == (XRRSizes_type)0x0) {
      bVar5 = true;
      local_20 = 0.0;
      local_24 = 0.0;
      goto LAB_001f2efe;
    }
  }
  pXVar9 = (*screen_init::XRRSizes_f)(fl_display,fl_screen,&nscreens);
  bVar5 = nscreens < 1;
  if (nscreens < 1) {
    local_20 = 0.0;
    local_24 = 0.0;
  }
  else {
    local_20 = 0.0;
    local_24 = 0.0;
    if (pXVar9->mwidth != 0) {
      local_24 = ((float)pXVar9->width * 25.4) / (float)pXVar9->mwidth;
    }
    if (pXVar9->mheight != 0) {
      local_20 = ((float)pXVar9->height * 25.4) / (float)pXVar9->mheight;
    }
  }
LAB_001f2efe:
  iVar7 = XineramaIsActive(fl_display);
  pDVar6 = fl_display;
  if (iVar7 == 0) {
    num_screens = 0x10;
    if ((int)*(uint *)(fl_display + 0xe4) < 0x10) {
      num_screens = *(uint *)(fl_display + 0xe4);
    }
    lVar8 = (long)fl_screen;
    uVar12 = 0;
    uVar10 = (ulong)(uint)num_screens;
    if (num_screens < 1) {
      uVar10 = uVar12;
    }
    lVar11 = 4;
    for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      screens[uVar12].x_org = 0;
      screens[uVar12].y_org = 0;
      lVar4 = *(long *)(pDVar6 + 0xe8);
      sVar1 = *(short *)(lVar4 + -8 + lVar11 * 8);
      screens[uVar12].width = sVar1;
      sVar2 = *(short *)(lVar4 + -4 + lVar11 * 8);
      screens[uVar12].height = sVar2;
      if (bVar5) {
        iVar7 = *(int *)(lVar4 + lVar11 * 8);
        fVar14 = 0.0;
        if (iVar7 != 0) {
          fVar14 = ((float)(int)sVar1 * 25.4) / (float)iVar7;
        }
        dpi[uVar12][0] = fVar14;
        iVar7 = *(int *)(lVar4 + 0x24 + lVar8 * 0x80);
        fVar14 = 0.0;
        if (iVar7 != 0) {
          fVar14 = ((float)(int)sVar2 * 25.4) / (float)iVar7;
        }
      }
      else {
        dpi[uVar12][0] = local_24;
        fVar14 = local_20;
      }
      dpi[uVar12][1] = fVar14;
      lVar11 = lVar11 + 0x10;
    }
  }
  else {
    lVar8 = XineramaQueryScreens(fl_display,&num_screens);
    pDVar6 = fl_display;
    if (0x10 < num_screens) {
      num_screens = 0x10;
    }
    lVar11 = (long)fl_screen;
    uVar12 = 0;
    uVar10 = (ulong)(uint)num_screens;
    if (num_screens < 1) {
      uVar10 = uVar12;
    }
    puVar13 = (undefined8 *)(lVar8 + 4);
    for (; uVar10 * 8 != uVar12; uVar12 = uVar12 + 8) {
      uVar3 = *puVar13;
      *(undefined8 *)((long)&screens[0].x_org + uVar12) = uVar3;
      if (bVar5) {
        lVar4 = *(long *)(pDVar6 + 0xe8);
        iVar7 = *(int *)(lVar4 + 0x20 + lVar11 * 0x80);
        fVar14 = 0.0;
        if (iVar7 != 0) {
          fVar14 = ((float)(int)(short)((ulong)uVar3 >> 0x20) * 25.4) / (float)iVar7;
        }
        *(float *)((long)dpi[0] + uVar12) = fVar14;
        iVar7 = *(int *)(lVar4 + 0x24 + lVar11 * 0x80);
        fVar14 = 0.0;
        if (iVar7 != 0) {
          fVar14 = ((float)(int)(short)((ulong)uVar3 >> 0x30) * 25.4) / (float)iVar7;
        }
      }
      else {
        *(float *)((long)dpi[0] + uVar12) = local_24;
        fVar14 = local_20;
      }
      *(float *)((long)dpi[0] + uVar12 + 4) = fVar14;
      puVar13 = (undefined8 *)((long)puVar13 + 0xc);
    }
    if (lVar8 != 0) {
      XFree(lVar8);
    }
  }
  return;
}

Assistant:

static void screen_init() {
  if (!fl_display) fl_open_display();

  int dpi_by_randr = 0;
  float dpih = 0.0f, dpiv = 0.0f;

#if USE_XRANDR

  static XRRSizes_type XRRSizes_f = NULL;
  if (!XRRSizes_f) {
    void *libxrandr_addr = dlopen("libXrandr.so.2", RTLD_LAZY);
    if (!libxrandr_addr) libxrandr_addr = dlopen("libXrandr.so", RTLD_LAZY);
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
    if (!libxrandr_addr) libxrandr_addr = dlopen("/opt/X11/lib/libXrandr.dylib", RTLD_LAZY);
#   endif
    if (libxrandr_addr) XRRSizes_f = (XRRSizes_type)dlsym(libxrandr_addr, "XRRSizes");
  }
  if (XRRSizes_f) {
    int nscreens;
    XRRScreenSize *ssize = XRRSizes_f(fl_display, fl_screen, &nscreens);

    //for (int i=0; i<nscreens; i++)
    //  printf("width=%d height=%d mwidth=%d mheight=%d\n",
    //         ssize[i].width,ssize[i].height,ssize[i].mwidth,ssize[i].mheight);

    if (nscreens > 0) { // Note: XRRSizes() *may* return nscreens == 0, see docs
      int mm = ssize[0].mwidth;
      dpih = mm ? ssize[0].width*25.4f/mm : 0.0f;
      mm = ssize[0].mheight;
      dpiv = mm ? ssize[0].height*25.4f/mm : 0.0f;
      dpi_by_randr = 1;
    }
  }

#endif // USE_XRANDR

#if HAVE_XINERAMA

  if (XineramaIsActive(fl_display)) {
    XineramaScreenInfo *xsi = XineramaQueryScreens(fl_display, &num_screens);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    /* There's no way to use different DPI for different Xinerama screens. */
    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = xsi[i].x_org;
      screens[i].y_org = xsi[i].y_org;
      screens[i].width = xsi[i].width;
      screens[i].height = xsi[i].height;

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
        int mm = DisplayWidthMM(fl_display, fl_screen);
        dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
        mm = DisplayHeightMM(fl_display, fl_screen);
        dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
    if (xsi) XFree(xsi);
  } else

#endif // HAVE_XINERAMA

  { // ! HAVE_XINERAMA || ! XineramaIsActive()
    num_screens = ScreenCount(fl_display);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = 0;
      screens[i].y_org = 0;
      screens[i].width = DisplayWidth(fl_display, i);
      screens[i].height = DisplayHeight(fl_display, i);

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
	int mm = DisplayWidthMM(fl_display, i);
	dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
	mm = DisplayHeightMM(fl_display, fl_screen);
	dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
  }
}